

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O0

int Cudd_EquivDC(DdManager *dd,DdNode *F,DdNode *G,DdNode *D)

{
  uint uVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *local_d0;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint top;
  uint dlevel;
  uint glevel;
  uint flevel;
  int res;
  DdNode *Dvn;
  DdNode *Dv;
  DdNode *Gvn;
  DdNode *Gv;
  DdNode *Fvn;
  DdNode *Fv;
  DdNode *Dr;
  DdNode *Gr;
  DdNode *One;
  DdNode *tmp;
  DdNode *D_local;
  DdNode *G_local;
  DdNode *F_local;
  DdManager *dd_local;
  
  local_d0 = dd->one;
  if ((D == local_d0) || (F == G)) {
    dd_local._4_4_ = 1;
  }
  else if (((D == (DdNode *)((ulong)local_d0 ^ 1)) || (D == dd->zero)) ||
          (F == (DdNode *)((ulong)G ^ 1))) {
    dd_local._4_4_ = 0;
  }
  else {
    D_local = G;
    G_local = F;
    if (G < F) {
      D_local = F;
      G_local = G;
    }
    if (((ulong)G_local & 1) != 0) {
      G_local = (DdNode *)((ulong)G_local ^ 1);
      D_local = (DdNode *)((ulong)D_local ^ 1);
    }
    pDVar2 = cuddCacheLookup(dd,0x4a,G_local,D_local,D);
    if (pDVar2 == (DdNode *)0x0) {
      if (G_local->index == 0x7fffffff) {
        local_98 = G_local->index;
      }
      else {
        local_98 = dd->perm[G_local->index];
      }
      pDVar2 = (DdNode *)((ulong)D_local & 0xfffffffffffffffe);
      if (pDVar2->index == 0x7fffffff) {
        local_9c = pDVar2->index;
      }
      else {
        local_9c = dd->perm[pDVar2->index];
      }
      if (local_9c < local_98) {
        local_a0 = local_9c;
      }
      else {
        local_a0 = local_98;
      }
      pDVar3 = (DdNode *)((ulong)D & 0xfffffffffffffffe);
      uVar1 = dd->perm[pDVar3->index];
      local_a4 = uVar1;
      if (local_a0 <= uVar1) {
        local_a4 = local_a0;
      }
      if (local_a4 == local_98) {
        Fvn = (G_local->type).kids.T;
        Gv = (G_local->type).kids.E;
      }
      else {
        Gv = G_local;
        Fvn = G_local;
      }
      if (local_a4 == local_9c) {
        Gvn = (pDVar2->type).kids.T;
        Dv = (pDVar2->type).kids.E;
        if (D_local != pDVar2) {
          Gvn = (DdNode *)((ulong)Gvn ^ 1);
          Dv = (DdNode *)((ulong)Dv ^ 1);
        }
      }
      else {
        Dv = D_local;
        Gvn = D_local;
      }
      _flevel = D;
      Dvn = D;
      if (local_a4 == uVar1) {
        Dvn = (pDVar3->type).kids.T;
        _flevel = (pDVar3->type).kids.E;
        if (D != pDVar3) {
          Dvn = (DdNode *)((ulong)Dvn ^ 1);
          _flevel = (DdNode *)((ulong)_flevel ^ 1);
        }
      }
      glevel = Cudd_EquivDC(dd,Fvn,Gvn,Dvn);
      if (glevel != 0) {
        glevel = Cudd_EquivDC(dd,Gv,Dv,_flevel);
      }
      if (glevel == 0) {
        local_d0 = (DdNode *)((ulong)local_d0 ^ 1);
      }
      cuddCacheInsert(dd,0x4a,G_local,D_local,D,local_d0);
      dd_local._4_4_ = glevel;
    }
    else {
      dd_local._4_4_ = (uint)(pDVar2 == local_d0);
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_EquivDC(
  DdManager * dd,
  DdNode * F,
  DdNode * G,
  DdNode * D)
{
    DdNode *tmp, *One, *Gr, *Dr;
    DdNode *Fv, *Fvn, *Gv, *Gvn, *Dv, *Dvn;
    int res;
    unsigned int flevel, glevel, dlevel, top;

    One = DD_ONE(dd);

    statLine(dd);
    /* Check terminal cases. */
    if (D == One || F == G) return(1);
    if (D == Cudd_Not(One) || D == DD_ZERO(dd) || F == Cudd_Not(G)) return(0);

    /* From now on, D is non-constant. */

    /* Normalize call to increase cache efficiency. */
    if (F > G) {
        tmp = F;
        F = G;
        G = tmp;
    }
    if (Cudd_IsComplement(F)) {
        F = Cudd_Not(F);
        G = Cudd_Not(G);
    }

    /* From now on, F is regular. */

    /* Check cache. */
    tmp = cuddCacheLookup(dd,DD_EQUIV_DC_TAG,F,G,D);
    if (tmp != NULL) return(tmp == One);

    /* Find splitting variable. */
    flevel = cuddI(dd,F->index);
    Gr = Cudd_Regular(G);
    glevel = cuddI(dd,Gr->index);
    top = ddMin(flevel,glevel);
    Dr = Cudd_Regular(D);
    dlevel = dd->perm[Dr->index];
    top = ddMin(top,dlevel);

    /* Compute cofactors. */
    if (top == flevel) {
        Fv = cuddT(F);
        Fvn = cuddE(F);
    } else {
        Fv = Fvn = F;
    }
    if (top == glevel) {
        Gv = cuddT(Gr);
        Gvn = cuddE(Gr);
        if (G != Gr) {
            Gv = Cudd_Not(Gv);
            Gvn = Cudd_Not(Gvn);
        }
    } else {
        Gv = Gvn = G;
    }
    if (top == dlevel) {
        Dv = cuddT(Dr);
        Dvn = cuddE(Dr);
        if (D != Dr) {
            Dv = Cudd_Not(Dv);
            Dvn = Cudd_Not(Dvn);
        }
    } else {
        Dv = Dvn = D;
    }

    /* Solve recursively. */
    res = Cudd_EquivDC(dd,Fv,Gv,Dv);
    if (res != 0) {
        res = Cudd_EquivDC(dd,Fvn,Gvn,Dvn);
    }
    cuddCacheInsert(dd,DD_EQUIV_DC_TAG,F,G,D,(res) ? One : Cudd_Not(One));

    return(res);

}